

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleObjectHandling.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Slice slice;
  ostream *poVar3;
  uint8_t *slice_00;
  Slice slice_01;
  int iVar4;
  Builder *sub;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  string_view attrName;
  string_view attrName_00;
  string_view attrName_01;
  string_view attrName_02;
  string_view attrName_03;
  string_view attrName_04;
  ArrayIterator __begin1;
  Builder values;
  Builder b;
  string local_218;
  _Any_data local_1f8;
  code *local_1e8;
  code *pcStack_1e0;
  uint8_t *local_1d0;
  ArrayIterator local_1c8;
  Builder local_1a0;
  Builder local_e8;
  
  arangodb::velocypack::Builder::Builder(&local_e8);
  arangodb::velocypack::Value::Value((Value *)&local_1a0,Object,false);
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e8,(Value *)&local_1a0);
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_1_ = 0xb;
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._4_4_ = 3;
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2a;
  attrName._M_str = "foo";
  attrName._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e8,attrName,(Value *)&local_1a0);
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_1_ = 0xe;
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._4_4_ = 6;
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x116048;
  attrName_00._M_str = "bar";
  attrName_00._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e8,attrName_00,(Value *)&local_1a0);
  arangodb::velocypack::Value::Value((Value *)&local_1a0,Object,false);
  attrName_01._M_str = "baz";
  attrName_01._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e8,attrName_01,(Value *)&local_1a0);
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_1_ = 3;
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._4_4_ = 1;
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_1_ = 1;
  attrName_02._M_str = "qux";
  attrName_02._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e8,attrName_02,(Value *)&local_1a0);
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_1_ = 0xe;
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._4_4_ = 6;
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x116067;
  attrName_03._M_str = "bart";
  attrName_03._M_len = 4;
  iVar4 = 4;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e8,attrName_03,(Value *)&local_1a0);
  arangodb::velocypack::Builder::close(&local_e8,iVar4);
  arangodb::velocypack::Value::Value((Value *)&local_1a0,Array,false);
  attrName_04._M_str = "quux";
  attrName_04._M_len = 4;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e8,attrName_04,(Value *)&local_1a0);
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_1_ = 0xb;
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._4_4_ = 3;
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e8,(Value *)&local_1a0);
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_1_ = 0xb;
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._4_4_ = 3;
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_e8,(Value *)&local_1a0);
  sub = &local_1a0;
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_4_ = CONCAT31(local_1a0._buffer.
                    super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr._1_3_,0xb);
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._4_4_ = 3;
  local_1a0._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&local_e8,(Value *)sub);
  iVar4 = (int)sub;
  arangodb::velocypack::Builder::close(&local_e8,iVar4);
  arangodb::velocypack::Builder::close(&local_e8,iVar4);
  slice._start = arangodb::velocypack::Builder::start(&local_e8);
  arangodb::velocypack::Collection::keys_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1a0,(Collection *)slice._start,slice_01);
  _Var2._M_pi = local_1a0._buffer.
                super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  for (p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(local_1a0._buffer.
                         super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._4_4_,
                         local_1a0._buffer.
                         super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._0_4_); p_Var5 != _Var2._M_pi; p_Var5 = p_Var5 + 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Object has key \'",0x10);
    lVar1._0_4_ = p_Var5->_M_use_count;
    lVar1._4_4_ = p_Var5->_M_weak_count;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)p_Var5->_vptr__Sp_counted_base,lVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1a0);
  arangodb::velocypack::Collection::values(&local_1a0,slice);
  if (local_1a0._pos == 0) {
    slice_00 = "";
  }
  else {
    slice_00 = arangodb::velocypack::Builder::start(&local_1a0);
  }
  arangodb::velocypack::ArrayIterator::ArrayIterator((ArrayIterator *)&local_1f8,(Slice)slice_00);
  local_1c8._size = (ValueLength)local_1e8;
  local_1c8._position = (ValueLength)pcStack_1e0;
  local_1c8._slice._start = (uint8_t *)local_1f8._M_unused._0_8_;
  local_1c8._current = (uint8_t *)local_1f8._8_8_;
  if (pcStack_1e0 != local_1e8) {
    do {
      local_1d0 = (uint8_t *)arangodb::velocypack::ArrayIterator::value(&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Object value is: ",0x11);
      poVar3 = arangodb::velocypack::operator<<((ostream *)&std::cout,(Slice *)&local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", as JSON: ",0xb);
      arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
      toJson_abi_cxx11_(&local_218,
                        (SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)
                        &local_1d0,&arangodb::velocypack::Options::Defaults);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_218._M_dataplus._M_p,local_218._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      arangodb::velocypack::ArrayIterator::next(&local_1c8);
    } while (local_1c8._position != local_1c8._size);
  }
  local_1f8._M_unused._M_object = (void *)0x0;
  local_1f8._8_8_ = 0;
  pcStack_1e0 = std::
                _Function_handler<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/examples/exampleObjectHandling.cpp:48:7)>
                ::_M_invoke;
  local_1e8 = std::
              _Function_handler<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/examples/exampleObjectHandling.cpp:48:7)>
              ::_M_manager;
  arangodb::velocypack::Collection::visitRecursive
            (slice,PostOrder,
             (function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)&local_1f8
            );
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
  }
  arangodb::velocypack::Builder::~Builder(&local_1a0);
  arangodb::velocypack::Builder::~Builder(&local_e8);
  return 0;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // create an object with a few members
  Builder b;

  b(Value(ValueType::Object));
  b.add("foo", Value(42));
  b.add("bar", Value("some string value"));
  b.add("baz", Value(ValueType::Object));
  b.add("qux", Value(true));
  b.add("bart", Value("this is a string"));
  b.close();
  b.add("quux", Value(ValueType::Array));
  b.add(Value(1));
  b.add(Value(2));
  b.add(Value(3));
  b.close();
  b.close();

  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  // get all object keys. returns a vector of strings
  for (auto const& key : Collection::keys(s)) {
    // print key
    std::cout << "Object has key '" << key << "'" << std::endl;
  }

  // get all object values. returns a Builder object with an Array inside
  Builder values = Collection::values(s);
  for (auto const& value : ArrayIterator(values.slice())) {
    std::cout << "Object value is: " << value << ", as JSON: " << value.toJson()
              << std::endl;
  }

  // recursively visit all members in the Object
  // PostOrder here means we'll be visiting compound members before
  // we're diving into their subvalues
  Collection::visitRecursive(
      s, Collection::PostOrder,
      [](Slice const& key, Slice const& value) -> bool {
        if (!key.isNone()) {
          // we are visiting an Object member
          std::cout << "Visiting Object member: " << key.copyString()
                    << ", value: " << value.toJson() << std::endl;
        } else {
          // we are visiting an Array member
          std::cout << "Visiting Array member: " << value.toJson() << std::endl;
        }
        // to continue visiting, return true. to abort visiting, return false
        return true;
      });

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}